

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopInsert(WhereLoopBuilder *pBuilder,WhereLoop *pTemplate)

{
  WhereInfo *pWVar1;
  sqlite3 *db_00;
  WhereLoop *p_00;
  WhereLoop **ppWVar2;
  Index *pIndex;
  WhereLoop *pToDel;
  WhereLoop **ppTail;
  int rc;
  sqlite3 *db;
  WhereInfo *pWInfo;
  WhereLoop *p;
  WhereLoop **ppPrev;
  WhereLoop *pTemplate_local;
  WhereLoopBuilder *pBuilder_local;
  
  pWVar1 = pBuilder->pWInfo;
  db_00 = pWVar1->pParse->db;
  if (pBuilder->pOrSet == (WhereOrSet *)0x0) {
    whereLoopAdjustCost(pWVar1->pLoops,pTemplate);
    ppWVar2 = whereLoopFindLesser(&pWVar1->pLoops,pTemplate);
    if (ppWVar2 == (WhereLoop **)0x0) {
      pBuilder_local._4_4_ = 0;
    }
    else {
      pWInfo = (WhereInfo *)*ppWVar2;
      if (pWInfo == (WhereInfo *)0x0) {
        pWInfo = (WhereInfo *)sqlite3DbMallocRawNN(db_00,0x60);
        *ppWVar2 = (WhereLoop *)pWInfo;
        if (pWInfo == (WhereInfo *)0x0) {
          return 7;
        }
        whereLoopInit((WhereLoop *)pWInfo);
        *(WhereLoop **)&pWInfo->wctrlFlags = (WhereLoop *)0x0;
      }
      else {
        pToDel = (WhereLoop *)&pWInfo->wctrlFlags;
        while (((pToDel->prereq != 0 &&
                (pToDel = (WhereLoop *)whereLoopFindLesser((WhereLoop **)pToDel,pTemplate),
                pToDel != (WhereLoop *)0x0)) &&
               (p_00 = (WhereLoop *)pToDel->prereq, p_00 != (WhereLoop *)0x0))) {
          pToDel->prereq = (Bitmask)p_00->pNextLoop;
          whereLoopDelete(db_00,p_00);
        }
      }
      pBuilder_local._4_4_ = whereLoopXfer(db_00,(WhereLoop *)pWInfo,pTemplate);
      if ((((*(uint *)&pWInfo->iLimit & 0x400) == 0) && (pWInfo->pWhere != (Expr *)0x0)) &&
         (*(int *)&pWInfo->pWhere[1].pLeft == 0)) {
        pWInfo->pWhere = (Expr *)0x0;
      }
    }
  }
  else {
    if (pTemplate->nLTerm != 0) {
      whereOrInsert(pBuilder->pOrSet,pTemplate->prereq,pTemplate->rRun,pTemplate->nOut);
    }
    pBuilder_local._4_4_ = 0;
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereLoopInsert(WhereLoopBuilder *pBuilder, WhereLoop *pTemplate){
  WhereLoop **ppPrev, *p;
  WhereInfo *pWInfo = pBuilder->pWInfo;
  sqlite3 *db = pWInfo->pParse->db;
  int rc;

  /* If pBuilder->pOrSet is defined, then only keep track of the costs
  ** and prereqs.
  */
  if( pBuilder->pOrSet!=0 ){
    if( pTemplate->nLTerm ){
#if WHERETRACE_ENABLED
      u16 n = pBuilder->pOrSet->n;
      int x =
#endif
      whereOrInsert(pBuilder->pOrSet, pTemplate->prereq, pTemplate->rRun,
                                    pTemplate->nOut);
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(x?"   or-%d:  ":"   or-X:  ", n);
        whereLoopPrint(pTemplate, pBuilder->pWC);
      }
#endif
    }
    return SQLITE_OK;
  }

  /* Look for an existing WhereLoop to replace with pTemplate
  */
  whereLoopAdjustCost(pWInfo->pLoops, pTemplate);
  ppPrev = whereLoopFindLesser(&pWInfo->pLoops, pTemplate);

  if( ppPrev==0 ){
    /* There already exists a WhereLoop on the list that is better
    ** than pTemplate, so just ignore pTemplate */
#if WHERETRACE_ENABLED /* 0x8 */
    if( sqlite3WhereTrace & 0x8 ){
      sqlite3DebugPrintf("   skip: ");
      whereLoopPrint(pTemplate, pBuilder->pWC);
    }
#endif
    return SQLITE_OK;  
  }else{
    p = *ppPrev;
  }

  /* If we reach this point it means that either p[] should be overwritten
  ** with pTemplate[] if p[] exists, or if p==NULL then allocate a new
  ** WhereLoop and insert it.
  */
#if WHERETRACE_ENABLED /* 0x8 */
  if( sqlite3WhereTrace & 0x8 ){
    if( p!=0 ){
      sqlite3DebugPrintf("replace: ");
      whereLoopPrint(p, pBuilder->pWC);
      sqlite3DebugPrintf("   with: ");
    }else{
      sqlite3DebugPrintf("    add: ");
    }
    whereLoopPrint(pTemplate, pBuilder->pWC);
  }
#endif
  if( p==0 ){
    /* Allocate a new WhereLoop to add to the end of the list */
    *ppPrev = p = sqlite3DbMallocRawNN(db, sizeof(WhereLoop));
    if( p==0 ) return SQLITE_NOMEM_BKPT;
    whereLoopInit(p);
    p->pNextLoop = 0;
  }else{
    /* We will be overwriting WhereLoop p[].  But before we do, first
    ** go through the rest of the list and delete any other entries besides
    ** p[] that are also supplated by pTemplate */
    WhereLoop **ppTail = &p->pNextLoop;
    WhereLoop *pToDel;
    while( *ppTail ){
      ppTail = whereLoopFindLesser(ppTail, pTemplate);
      if( ppTail==0 ) break;
      pToDel = *ppTail;
      if( pToDel==0 ) break;
      *ppTail = pToDel->pNextLoop;
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(" delete: ");
        whereLoopPrint(pToDel, pBuilder->pWC);
      }
#endif
      whereLoopDelete(db, pToDel);
    }
  }
  rc = whereLoopXfer(db, p, pTemplate);
  if( (p->wsFlags & WHERE_VIRTUALTABLE)==0 ){
    Index *pIndex = p->u.btree.pIndex;
    if( pIndex && pIndex->tnum==0 ){
      p->u.btree.pIndex = 0;
    }
  }
  return rc;
}